

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsKrylovDemo_ls.c
# Opt level: O0

void FreeUserData(UserData data)

{
  void *in_RDI;
  int jy;
  int jx;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
      SUNDlsMat_destroyMat
                (*(undefined8 *)((long)in_RDI + (long)local_10 * 8 + (long)local_c * 0x50));
      SUNDlsMat_destroyMat
                (*(undefined8 *)((long)in_RDI + (long)local_10 * 8 + (long)local_c * 0x50 + 800));
      SUNDlsMat_destroyArray
                (*(undefined8 *)((long)in_RDI + (long)local_10 * 8 + (long)local_c * 0x50 + 0x640));
    }
  }
  free(in_RDI);
  return;
}

Assistant:

static void FreeUserData(UserData data)
{
  int jx, jy;

  for (jx = 0; jx < MX; jx++)
  {
    for (jy = 0; jy < MY; jy++)
    {
      SUNDlsMat_destroyMat((data->P)[jx][jy]);
      SUNDlsMat_destroyMat((data->Jbd)[jx][jy]);
      SUNDlsMat_destroyArray((data->pivot)[jx][jy]);
    }
  }

  free(data);
}